

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_zip.c
# Opt level: O1

int archive_write_zip_header(archive_write *a,archive_entry *entry)

{
  byte *pbVar1;
  char cVar2;
  undefined4 uVar3;
  zip_conflict *zip;
  bool bVar4;
  size_t sVar5;
  mode_t mVar6;
  wchar_t wVar7;
  int iVar8;
  mode_t mVar9;
  uint uVar10;
  wchar_t wVar11;
  wchar_t wVar12;
  uchar *pp;
  archive_string_conv *paVar13;
  int64_t iVar14;
  unsigned_long uVar15;
  archive_entry *paVar16;
  int *piVar17;
  char *pcVar18;
  size_t sVar19;
  size_t sVar20;
  uchar *puVar21;
  time_t tVar22;
  uchar *__dest;
  compression cVar23;
  char *pcVar24;
  size_t sVar25;
  uchar uVar26;
  uchar *p_1;
  uchar *puVar27;
  int local_f4;
  size_t len;
  undefined2 uStack_e0;
  uint uStack_de;
  undefined2 uStack_da;
  undefined2 local_d8;
  undefined4 uStack_d6;
  undefined2 uStack_d2;
  undefined2 uStack_d0;
  undefined2 uStack_ce;
  undefined2 uStack_cc;
  undefined2 uStack_ca;
  size_t local_c8;
  char *local_c0;
  uchar local_extra [128];
  
  zip = (zip_conflict *)a->format_data;
  paVar13 = zip->opt_sconv;
  if (paVar13 == (archive_string_conv *)0x0) {
    if (zip->init_default_conversion == 0) {
      paVar13 = archive_string_default_conversion_for_write(&a->archive);
      zip->sconv_default = paVar13;
      zip->init_default_conversion = 1;
    }
    paVar13 = zip->sconv_default;
  }
  mVar6 = archive_entry_filetype(entry);
  if (((mVar6 != 0x4000) && (mVar6 != 0x8000)) && (mVar6 != 0xa000)) {
    pcVar24 = "Filetype not supported";
    goto LAB_0047f411;
  }
  if ((zip->flags & 1) != 0) {
    wVar7 = archive_entry_size_is_set(entry);
    if ((wVar7 != L'\0') && (iVar14 = archive_entry_size(entry), 0xffffffff < iVar14)) {
      pcVar24 = "Files > 4GB require Zip64 extensions";
LAB_0047f411:
      archive_set_error(&a->archive,-1,pcVar24);
      return -0x19;
    }
    if (0xffffffff < zip->written_bytes) {
      pcVar24 = "Archives > 4GB require Zip64 extensions";
      goto LAB_0047f411;
    }
  }
  if (mVar6 != 0x8000) {
    archive_entry_set_size(entry,0);
  }
  zip->entry_offset = zip->written_bytes;
  zip->entry_uncompressed_limit = 0x7fffffffffffffff;
  zip->entry_flags = 0;
  zip->entry_uses_zip64 = 0;
  zip->entry_compressed_size = 0;
  zip->entry_uncompressed_size = 0;
  zip->entry_compressed_written = 0;
  zip->entry_uncompressed_written = 0;
  uVar15 = (*zip->crc32func)(0,(void *)0x0,0);
  zip->entry_crc32 = (uint32_t)uVar15;
  if (zip->entry != (archive_entry *)0x0) {
    archive_entry_free(zip->entry);
    zip->entry = (archive_entry *)0x0;
  }
  paVar16 = archive_entry_clone(entry);
  zip->entry = paVar16;
  if (paVar16 == (archive_entry *)0x0) {
    pcVar24 = "Can\'t allocate zip header data";
    goto LAB_0047f435;
  }
  if (paVar13 == (archive_string_conv *)0x0) {
    local_f4 = 0;
  }
  else {
    wVar7 = _archive_entry_pathname_l(entry,(char **)local_extra,&len,paVar13);
    if (wVar7 == L'\0') {
      local_f4 = 0;
LAB_0047f4a1:
      if (len != 0) {
        archive_entry_set_pathname
                  (zip->entry,
                   (char *)CONCAT44(local_extra._4_4_,
                                    CONCAT13(local_extra[3],
                                             CONCAT12(local_extra[2],local_extra._0_2_))));
      }
      bVar4 = true;
      if (mVar6 == 0xa000) {
        wVar7 = _archive_entry_symlink_l(entry,(char **)local_extra,&len,paVar13);
        if (wVar7 == L'\0') {
          if (len != 0) {
            archive_entry_set_symlink
                      (zip->entry,
                       (char *)CONCAT44(local_extra._4_4_,
                                        CONCAT13(local_extra[3],
                                                 CONCAT12(local_extra[2],local_extra._0_2_))));
          }
        }
        else {
          piVar17 = __errno_location();
          if (*piVar17 == 0xc) {
            bVar4 = false;
            archive_set_error(&a->archive,0xc,"Can\'t allocate memory  for Symlink");
          }
        }
      }
    }
    else {
      piVar17 = __errno_location();
      if (*piVar17 != 0xc) {
        pcVar24 = archive_entry_pathname(entry);
        pcVar18 = archive_string_conversion_charset_name(paVar13);
        archive_set_error(&a->archive,0x54,"Can\'t translate Pathname \'%s\' to %s",pcVar24,pcVar18)
        ;
        local_f4 = -0x14;
        goto LAB_0047f4a1;
      }
      local_f4 = 0;
      archive_set_error(&a->archive,0xc,"Can\'t allocate memory for Pathname");
      bVar4 = false;
    }
    if (!bVar4) {
      return -0x1e;
    }
  }
  pcVar24 = archive_entry_pathname(zip->entry);
  do {
    cVar2 = *pcVar24;
    pcVar24 = pcVar24 + 1;
  } while ('\0' < cVar2);
  if (cVar2 != '\0') {
    if (zip->opt_sconv == (archive_string_conv *)0x0) {
      pcVar24 = nl_langinfo(0xe);
    }
    else {
      pcVar24 = archive_string_conversion_charset_name(zip->opt_sconv);
    }
    iVar8 = strcmp(pcVar24,"UTF-8");
    if (iVar8 == 0) {
      pbVar1 = (byte *)((long)&zip->entry_flags + 1);
      *pbVar1 = *pbVar1 | 8;
    }
  }
  paVar16 = zip->entry;
  mVar9 = archive_entry_filetype(paVar16);
  pcVar24 = archive_entry_pathname(paVar16);
  if (pcVar24 == (char *)0x0) {
    sVar19 = 0;
  }
  else if ((mVar9 == 0x4000) &&
          ((*pcVar24 == '\0' || (sVar19 = strlen(pcVar24), pcVar24[sVar19 - 1] != '/')))) {
    sVar19 = strlen(pcVar24);
    sVar19 = sVar19 + 1;
  }
  else {
    sVar19 = strlen(pcVar24);
  }
  if (mVar6 == 0xa000) {
    pcVar24 = archive_entry_symlink(zip->entry);
    if (pcVar24 == (char *)0x0) {
      sVar20 = 0;
    }
    else {
      sVar20 = strlen(pcVar24);
    }
    zip->entry_uncompressed_limit = sVar20;
    zip->entry_compressed_size = sVar20;
    zip->entry_uncompressed_size = sVar20;
    uVar15 = (*zip->crc32func)((unsigned_long)zip->entry_crc32,pcVar24,sVar20);
    zip->entry_crc32 = (uint32_t)uVar15;
    zip->entry_compression = COMPRESSION_STORE;
    uVar26 = '\x14';
  }
  else {
    if (mVar6 == 0x8000) {
      wVar7 = archive_entry_size_is_set(zip->entry);
      if (wVar7 == L'\0') {
        zip->entry_compression = COMPRESSION_DEFLATE;
        *(byte *)&zip->entry_flags = (byte)zip->entry_flags | 8;
        if ((zip->flags & 1) != 0) goto LAB_0047f687;
        zip->entry_uses_zip64 = 1;
        uVar26 = '-';
      }
      else {
        iVar14 = archive_entry_size(zip->entry);
        zip->entry_uncompressed_limit = iVar14;
        cVar23 = COMPRESSION_DEFLATE;
        if (zip->requested_compression != COMPRESSION_UNSPECIFIED) {
          cVar23 = zip->requested_compression;
        }
        zip->entry_compression = cVar23;
        uVar26 = '\x14';
        if (cVar23 == COMPRESSION_STORE) {
          zip->entry_compressed_size = iVar14;
          uVar26 = '\n';
        }
        zip->entry_uncompressed_size = iVar14;
        if ((byte)(0xffffffff < iVar14 | ((byte)zip->flags & 2) >> 1) == 1) {
          zip->entry_uses_zip64 = 1;
          uVar26 = '-';
        }
        *(byte *)&zip->entry_flags = (byte)zip->entry_flags | 8;
      }
    }
    else {
      zip->entry_compression = COMPRESSION_STORE;
      zip->entry_uncompressed_limit = 0;
LAB_0047f687:
      uVar26 = '\x14';
    }
    sVar20 = 0;
    pcVar24 = (char *)0x0;
  }
  uStack_de = 0;
  uStack_da = 0;
  local_d8 = 0;
  uStack_d6 = 0;
  uStack_d2 = 0;
  uStack_d0 = 0;
  uStack_ce = 0;
  uStack_cc = 0;
  uStack_ca = 0;
  len._0_6_ = (uint6)CONCAT14(uVar26,0x4034b50);
  len = CONCAT26((short)zip->entry_flags,(uint6)len);
  uStack_e0 = (undefined2)zip->entry_compression;
  archive_entry_mtime(zip->entry);
  uStack_de = dos_time(0x47f700);
  uStack_da = (undefined2)zip->entry_crc32;
  local_d8 = (undefined2)(zip->entry_crc32 >> 0x10);
  if (zip->entry_uses_zip64 == 0) {
    uStack_d6 = (undefined4)zip->entry_compressed_size;
    uVar3 = (undefined4)zip->entry_uncompressed_size;
    uStack_d2 = (undefined2)uVar3;
    uStack_d0 = (undefined2)((uint)uVar3 >> 0x10);
  }
  else {
    uStack_d6 = 0xffffffff;
    uStack_d2 = 0xffff;
    uStack_d0 = 0xffff;
  }
  uStack_ce = (short)sVar19;
  local_c8 = sVar20;
  local_c0 = pcVar24;
  puVar21 = cd_alloc(zip,0x2e);
  zip->file_header = puVar21;
  zip->central_directory_entries = zip->central_directory_entries + 1;
  puVar21[0] = '\0';
  puVar21[1] = '\0';
  puVar21[2] = '\0';
  puVar21[3] = '\0';
  puVar21[4] = '\0';
  puVar21[5] = '\0';
  puVar21[6] = '\0';
  puVar21[7] = '\0';
  puVar21[8] = '\0';
  puVar21[9] = '\0';
  puVar21[10] = '\0';
  puVar21[0xb] = '\0';
  puVar21[0xc] = '\0';
  puVar21[0xd] = '\0';
  puVar21[0xe] = '\0';
  puVar21[0xf] = '\0';
  puVar21[0x10] = '\0';
  puVar21[0x11] = '\0';
  puVar21[0x12] = '\0';
  puVar21[0x13] = '\0';
  puVar21[0x14] = '\0';
  puVar21[0x15] = '\0';
  puVar21[0x16] = '\0';
  puVar21[0x17] = '\0';
  puVar21[0x18] = '\0';
  puVar21[0x19] = '\0';
  puVar21[0x1a] = '\0';
  puVar21[0x1b] = '\0';
  puVar21[0x1c] = '\0';
  puVar21[0x1d] = '\0';
  puVar21[0x1e] = '\0';
  puVar21[0x1f] = '\0';
  puVar21[0x1e] = '\0';
  puVar21[0x1f] = '\0';
  puVar21[0x20] = '\0';
  puVar21[0x21] = '\0';
  puVar21[0x22] = '\0';
  puVar21[0x23] = '\0';
  puVar21[0x24] = '\0';
  puVar21[0x25] = '\0';
  puVar21[0x26] = '\0';
  puVar21[0x27] = '\0';
  puVar21[0x28] = '\0';
  puVar21[0x29] = '\0';
  puVar21[0x2a] = '\0';
  puVar21[0x2b] = '\0';
  puVar21[0x2c] = '\0';
  puVar21[0x2d] = '\0';
  builtin_memcpy(zip->file_header,"PK\x01\x02",4);
  puVar21 = zip->file_header;
  puVar21[4] = uVar26;
  puVar21[5] = '\x03';
  puVar21 = zip->file_header;
  puVar21[6] = uVar26;
  puVar21[7] = '\0';
  *(short *)(zip->file_header + 8) = (short)zip->entry_flags;
  *(short *)(zip->file_header + 10) = (short)zip->entry_compression;
  puVar21 = zip->file_header;
  archive_entry_mtime(zip->entry);
  uVar10 = dos_time(0x47f7ba);
  *(uint *)(puVar21 + 0xc) = uVar10;
  *(short *)(zip->file_header + 0x1c) = (short)sVar19;
  puVar21 = zip->file_header;
  mVar6 = archive_entry_mode(zip->entry);
  puVar21[0x26] = '\0';
  puVar21[0x27] = '\0';
  puVar21[0x28] = (uchar)mVar6;
  puVar21[0x29] = (uchar)(mVar6 >> 8);
  puVar21 = cd_alloc(zip,sVar19);
  paVar16 = zip->entry;
  pcVar24 = archive_entry_pathname(paVar16);
  sVar19 = strlen(pcVar24);
  mVar6 = archive_entry_filetype(paVar16);
  memcpy(puVar21,pcVar24,sVar19);
  if ((mVar6 == 0x4000) && (pcVar24[sVar19 - 1] != '/')) {
    (puVar21 + sVar19)[0] = '/';
    (puVar21 + sVar19)[1] = '\0';
  }
  local_extra[2] = '\0';
  local_extra[3] = '\0';
  local_extra[4] = '\0';
  local_extra[5] = '\0';
  local_extra[6] = '\0';
  local_extra[7] = '\0';
  local_extra[8] = '\0';
  local_extra[9] = '\0';
  local_extra[10] = '\0';
  local_extra[0xb] = '\0';
  local_extra[0xc] = '\0';
  local_extra[0xd] = '\0';
  local_extra[0xe] = '\0';
  local_extra[0xf] = '\0';
  local_extra[0x70] = '\0';
  local_extra[0x71] = '\0';
  local_extra[0x72] = '\0';
  local_extra[0x73] = '\0';
  local_extra[0x74] = '\0';
  local_extra[0x75] = '\0';
  local_extra[0x76] = '\0';
  local_extra[0x77] = '\0';
  local_extra[0x78] = '\0';
  local_extra[0x79] = '\0';
  local_extra[0x7a] = '\0';
  local_extra[0x7b] = '\0';
  local_extra[0x7c] = '\0';
  local_extra[0x7d] = '\0';
  local_extra[0x7e] = '\0';
  local_extra[0x7f] = '\0';
  local_extra[0x60] = '\0';
  local_extra[0x61] = '\0';
  local_extra[0x62] = '\0';
  local_extra[99] = '\0';
  local_extra[100] = '\0';
  local_extra[0x65] = '\0';
  local_extra[0x66] = '\0';
  local_extra[0x67] = '\0';
  local_extra[0x68] = '\0';
  local_extra[0x69] = '\0';
  local_extra[0x6a] = '\0';
  local_extra[0x6b] = '\0';
  local_extra[0x6c] = '\0';
  local_extra[0x6d] = '\0';
  local_extra[0x6e] = '\0';
  local_extra[0x6f] = '\0';
  local_extra[0x50] = '\0';
  local_extra[0x51] = '\0';
  local_extra[0x52] = '\0';
  local_extra[0x53] = '\0';
  local_extra[0x54] = '\0';
  local_extra[0x55] = '\0';
  local_extra[0x56] = '\0';
  local_extra[0x57] = '\0';
  local_extra[0x58] = '\0';
  local_extra[0x59] = '\0';
  local_extra[0x5a] = '\0';
  local_extra[0x5b] = '\0';
  local_extra[0x5c] = '\0';
  local_extra[0x5d] = '\0';
  local_extra[0x5e] = '\0';
  local_extra[0x5f] = '\0';
  local_extra[0x40] = '\0';
  local_extra[0x41] = '\0';
  local_extra[0x42] = '\0';
  local_extra[0x43] = '\0';
  local_extra[0x44] = '\0';
  local_extra[0x45] = '\0';
  local_extra[0x46] = '\0';
  local_extra[0x47] = '\0';
  local_extra[0x48] = '\0';
  local_extra[0x49] = '\0';
  local_extra[0x4a] = '\0';
  local_extra[0x4b] = '\0';
  local_extra[0x4c] = '\0';
  local_extra[0x4d] = '\0';
  local_extra[0x4e] = '\0';
  local_extra[0x4f] = '\0';
  local_extra[0x30] = '\0';
  local_extra[0x31] = '\0';
  local_extra[0x32] = '\0';
  local_extra[0x33] = '\0';
  local_extra[0x34] = '\0';
  local_extra[0x35] = '\0';
  local_extra[0x36] = '\0';
  local_extra[0x37] = '\0';
  local_extra[0x38] = '\0';
  local_extra[0x39] = '\0';
  local_extra[0x3a] = '\0';
  local_extra[0x3b] = '\0';
  local_extra[0x3c] = '\0';
  local_extra[0x3d] = '\0';
  local_extra[0x3e] = '\0';
  local_extra[0x3f] = '\0';
  local_extra[0x20] = '\0';
  local_extra[0x21] = '\0';
  local_extra[0x22] = '\0';
  local_extra[0x23] = '\0';
  local_extra[0x24] = '\0';
  local_extra[0x25] = '\0';
  local_extra[0x26] = '\0';
  local_extra[0x27] = '\0';
  local_extra[0x28] = '\0';
  local_extra[0x29] = '\0';
  local_extra[0x2a] = '\0';
  local_extra[0x2b] = '\0';
  local_extra[0x2c] = '\0';
  local_extra[0x2d] = '\0';
  local_extra[0x2e] = '\0';
  local_extra[0x2f] = '\0';
  local_extra[0x10] = '\0';
  local_extra[0x11] = '\0';
  local_extra[0x12] = '\0';
  local_extra[0x13] = '\0';
  local_extra[0x14] = '\0';
  local_extra[0x15] = '\0';
  local_extra[0x16] = '\0';
  local_extra[0x17] = '\0';
  local_extra[0x18] = '\0';
  local_extra[0x19] = '\0';
  local_extra[0x1a] = '\0';
  local_extra[0x1b] = '\0';
  local_extra[0x1c] = '\0';
  local_extra[0x1d] = '\0';
  local_extra[0x1e] = '\0';
  local_extra[0x1f] = '\0';
  local_extra[0] = 'U';
  local_extra[1] = 'T';
  wVar7 = archive_entry_mtime_is_set(entry);
  wVar11 = archive_entry_atime_is_set(entry);
  wVar12 = archive_entry_ctime_is_set(entry);
  local_extra[2] =
       (wVar12 != L'\0') * '\x04' + (wVar11 != L'\0') * '\x04' + (wVar7 != L'\0') * '\x04' + '\x01';
  local_extra[3] = '\0';
  wVar7 = archive_entry_mtime_is_set(entry);
  wVar11 = archive_entry_atime_is_set(entry);
  wVar12 = archive_entry_ctime_is_set(entry);
  local_extra[4] = (wVar12 != L'\0') << 2 | (wVar11 != L'\0') * '\x02' | wVar7 != L'\0';
  wVar7 = archive_entry_mtime_is_set(entry);
  if (wVar7 == L'\0') {
    puVar21 = local_extra + 5;
  }
  else {
    tVar22 = archive_entry_mtime(entry);
    puVar21 = local_extra + 9;
    local_extra._5_3_ = (undefined3)tVar22;
    local_extra[8] = (uchar)((ulong)tVar22 >> 0x18);
  }
  wVar7 = archive_entry_atime_is_set(entry);
  if (wVar7 != L'\0') {
    tVar22 = archive_entry_atime(entry);
    *(int *)puVar21 = (int)tVar22;
    puVar21 = puVar21 + 4;
  }
  wVar7 = archive_entry_ctime_is_set(entry);
  if (wVar7 != L'\0') {
    tVar22 = archive_entry_ctime(entry);
    *(int *)puVar21 = (int)tVar22;
    puVar21 = puVar21 + 4;
  }
  puVar21[0] = 'u';
  puVar21[1] = 'x';
  puVar21[2] = '\v';
  puVar21[3] = '\0';
  puVar21[4] = '\x01';
  puVar21[5] = '\x04';
  iVar14 = archive_entry_uid(entry);
  puVar21[6] = (uchar)iVar14;
  puVar21[7] = (uchar)((ulong)iVar14 >> 8);
  puVar21[8] = (uchar)((ulong)iVar14 >> 0x10);
  puVar21[9] = (uchar)((ulong)iVar14 >> 0x18);
  puVar21[10] = '\x04';
  iVar14 = archive_entry_gid(entry);
  *(int *)(puVar21 + 0xb) = (int)iVar14;
  puVar27 = puVar21 + 0xf;
  zip->file_header_extra_offset = zip->central_directory_bytes;
  sVar25 = (long)puVar27 - (long)local_extra;
  __dest = cd_alloc(zip,sVar25);
  memcpy(__dest,local_extra,sVar25);
  if (zip->entry_uses_zip64 != 0) {
    puVar21[0xf] = '\x01';
    puVar21[0x10] = '\0';
    puVar21[0x11] = '\x10';
    puVar21[0x12] = '\0';
    *(int64_t *)(puVar21 + 0x13) = zip->entry_uncompressed_size;
    *(int64_t *)(puVar21 + 0x1b) = zip->entry_compressed_size;
    puVar21[0x11] = '\x10';
    puVar21[0x12] = '\0';
    puVar27 = puVar21 + 0x23;
  }
  if ((zip->flags & 4) != 0) {
    puVar27[0] = 'e';
    puVar27[1] = 'l';
    puVar27[2] = '\0';
    puVar27[3] = '\0';
    puVar27[4] = '\a';
    puVar27[5] = uVar26;
    puVar27[6] = '\x03';
    puVar27[7] = '\0';
    puVar27[8] = '\0';
    mVar6 = archive_entry_mode(zip->entry);
    puVar27[9] = '\0';
    puVar27[10] = '\0';
    puVar27[0xb] = (uchar)mVar6;
    puVar27[0xc] = (uchar)(mVar6 >> 8);
    puVar27[2] = '\t';
    puVar27[3] = '\0';
    puVar27 = puVar27 + 0xd;
  }
  sVar25 = (long)puVar27 - (long)local_extra;
  uStack_cc = (undefined2)sVar25;
  iVar8 = __archive_write_output(a,&len,0x1e);
  if (iVar8 != 0) {
    return -0x1e;
  }
  zip->written_bytes = zip->written_bytes + 0x1e;
  paVar16 = zip->entry;
  pcVar24 = archive_entry_pathname(paVar16);
  mVar6 = archive_entry_filetype(paVar16);
  sVar19 = strlen(pcVar24);
  iVar8 = __archive_write_output(a,pcVar24,sVar19);
  uVar10 = 0xffffffe2;
  if (iVar8 == 0) {
    sVar19 = strlen(pcVar24);
    if ((mVar6 == 0x4000) && (pcVar24[sVar19 - 1] != '/')) {
      iVar8 = __archive_write_output(a,"/",1);
      uVar10 = 0xffffffe2;
      if (iVar8 != 0) goto LAB_0047faf6;
      sVar19 = sVar19 + 1;
    }
    uVar10 = (uint)sVar19;
  }
LAB_0047faf6:
  if ((int)uVar10 < 1) {
    return -0x1e;
  }
  zip->written_bytes = zip->written_bytes + (ulong)uVar10;
  iVar8 = __archive_write_output(a,local_extra,sVar25);
  sVar5 = local_c8;
  if (iVar8 != 0) {
    return -0x1e;
  }
  zip->written_bytes = zip->written_bytes + sVar25;
  if (local_c0 != (char *)0x0) {
    iVar8 = __archive_write_output(a,local_c0,local_c8);
    if (iVar8 != 0) {
      return -0x1e;
    }
    zip->entry_compressed_written = zip->entry_compressed_written + sVar5;
    zip->entry_uncompressed_written = zip->entry_uncompressed_written + sVar5;
    zip->written_bytes = zip->written_bytes + sVar5;
  }
  if (zip->entry_compression != COMPRESSION_DEFLATE) {
    return local_f4;
  }
  (zip->stream).zalloc = (alloc_func)0x0;
  (zip->stream).zfree = (free_func)0x0;
  (zip->stream).opaque = (voidpf)0x0;
  (zip->stream).next_out = zip->buf;
  (zip->stream).avail_out = (uInt)zip->len_buf;
  iVar8 = cm_zlib_deflateInit2_((z_streamp_conflict)&zip->stream,-1,8,-0xf,8,0,"1.2.3",0x70);
  if (iVar8 == 0) {
    return local_f4;
  }
  pcVar24 = "Can\'t init deflate compressor";
LAB_0047f435:
  archive_set_error(&a->archive,0xc,pcVar24);
  return -0x1e;
}

Assistant:

static int
archive_write_zip_header(struct archive_write *a, struct archive_entry *entry)
{
	unsigned char local_header[32];
	unsigned char local_extra[128];
	struct zip *zip = a->format_data;
	unsigned char *e;
	unsigned char *cd_extra;
	size_t filename_length;
	const char *slink = NULL;
	size_t slink_size = 0;
	struct archive_string_conv *sconv = get_sconv(a, zip);
	int ret, ret2 = ARCHIVE_OK;
	int64_t size;
	mode_t type;
	int version_needed = 10;

	/* Ignore types of entries that we don't support. */
	type = archive_entry_filetype(entry);
	if (type != AE_IFREG && type != AE_IFDIR && type != AE_IFLNK) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Filetype not supported");
		return ARCHIVE_FAILED;
	};

	/* If we're not using Zip64, reject large files. */
	if (zip->flags & ZIP_FLAG_AVOID_ZIP64) {
		/* Reject entries over 4GB. */
		if (archive_entry_size_is_set(entry)
		    && (archive_entry_size(entry) > 0xffffffff)) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Files > 4GB require Zip64 extensions");
			return ARCHIVE_FAILED;
		}
		/* Reject entries if archive is > 4GB. */
		if (zip->written_bytes > 0xffffffff) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Archives > 4GB require Zip64 extensions");
			return ARCHIVE_FAILED;
		}
	}

	/* Only regular files can have size > 0. */
	if (type != AE_IFREG)
		archive_entry_set_size(entry, 0);


	/* Reset information from last entry. */
	zip->entry_offset = zip->written_bytes;
	zip->entry_uncompressed_limit = INT64_MAX;
	zip->entry_compressed_size = 0;
	zip->entry_uncompressed_size = 0;
	zip->entry_compressed_written = 0;
	zip->entry_uncompressed_written = 0;
	zip->entry_flags = 0;
	zip->entry_uses_zip64 = 0;
	zip->entry_crc32 = zip->crc32func(0, NULL, 0);
	if (zip->entry != NULL) {
		archive_entry_free(zip->entry);
		zip->entry = NULL;
	}

#if defined(_WIN32) && !defined(__CYGWIN__)
	/* Make sure the path separators in pahtname, hardlink and symlink
	 * are all slash '/', not the Windows path separator '\'. */
	zip->entry = __la_win_entry_in_posix_pathseparator(entry);
	if (zip->entry == entry)
		zip->entry = archive_entry_clone(entry);
#else
	zip->entry = archive_entry_clone(entry);
#endif
	if (zip->entry == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate zip header data");
		return (ARCHIVE_FATAL);
	}

	if (sconv != NULL) {
		const char *p;
		size_t len;

		if (archive_entry_pathname_l(entry, &p, &len, sconv) != 0) {
			if (errno == ENOMEM) {
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate memory for Pathname");
				return (ARCHIVE_FATAL);
			}
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Can't translate Pathname '%s' to %s",
			    archive_entry_pathname(entry),
			    archive_string_conversion_charset_name(sconv));
			ret2 = ARCHIVE_WARN;
		}
		if (len > 0)
			archive_entry_set_pathname(zip->entry, p);

		/*
		 * There is no standard for symlink handling; we convert
		 * it using the same character-set translation that we use
		 * for filename.
		 */
		if (type == AE_IFLNK) {
			if (archive_entry_symlink_l(entry, &p, &len, sconv)) {
				if (errno == ENOMEM) {
					archive_set_error(&a->archive, ENOMEM,
					    "Can't allocate memory "
					    " for Symlink");
					return (ARCHIVE_FATAL);
				}
				/* No error if we can't convert. */
			} else if (len > 0)
				archive_entry_set_symlink(zip->entry, p);
		}
	}

	/* If filename isn't ASCII and we can use UTF-8, set the UTF-8 flag. */
	if (!is_all_ascii(archive_entry_pathname(zip->entry))) {
		if (zip->opt_sconv != NULL) {
			if (strcmp(archive_string_conversion_charset_name(
					zip->opt_sconv), "UTF-8") == 0)
				zip->entry_flags |= ZIP_ENTRY_FLAG_UTF8_NAME;
#if HAVE_NL_LANGINFO
		} else if (strcmp(nl_langinfo(CODESET), "UTF-8") == 0) {
			zip->entry_flags |= ZIP_ENTRY_FLAG_UTF8_NAME;
#endif
		}
	}
	filename_length = path_length(zip->entry);

	/* Determine appropriate compression and size for this entry. */
	if (type == AE_IFLNK) {
		slink = archive_entry_symlink(zip->entry);
		if (slink != NULL)
			slink_size = strlen(slink);
		else
			slink_size = 0;
		zip->entry_uncompressed_limit = slink_size;
		zip->entry_compressed_size = slink_size;
		zip->entry_uncompressed_size = slink_size;
		zip->entry_crc32 = zip->crc32func(zip->entry_crc32,
		    (const unsigned char *)slink, slink_size);
		zip->entry_compression = COMPRESSION_STORE;
		version_needed = 20;
	} else if (type != AE_IFREG) {
		zip->entry_compression = COMPRESSION_STORE;
		zip->entry_uncompressed_limit = 0;
		size = 0;
		version_needed = 20;
	} else if (archive_entry_size_is_set(zip->entry)) {
		size = archive_entry_size(zip->entry);
		zip->entry_uncompressed_limit = size;
		zip->entry_compression = zip->requested_compression;
		if (zip->entry_compression == COMPRESSION_UNSPECIFIED) {
			zip->entry_compression = COMPRESSION_DEFAULT;
		}
		if (zip->entry_compression == COMPRESSION_STORE) {
			zip->entry_compressed_size = size;
			zip->entry_uncompressed_size = size;
			version_needed = 10;
		} else {
			zip->entry_uncompressed_size = size;
			version_needed = 20;
		}
		if ((zip->flags & ZIP_FLAG_FORCE_ZIP64) /* User asked. */
		    || (zip->entry_uncompressed_size > ARCHIVE_LITERAL_LL(0xffffffff))) { /* Large entry. */
			zip->entry_uses_zip64 = 1;
			version_needed = 45;
		}

		/* We may know the size, but never the CRC. */
		zip->entry_flags |= ZIP_ENTRY_FLAG_LENGTH_AT_END;
	} else {
		/* Prefer deflate if it's available, because deflate
		 * has a clear end-of-data marker that makes
		 * length-at-end more reliable. */
		zip->entry_compression = COMPRESSION_DEFAULT;
		zip->entry_flags |= ZIP_ENTRY_FLAG_LENGTH_AT_END;
		if ((zip->flags & ZIP_FLAG_AVOID_ZIP64) == 0) {
			zip->entry_uses_zip64 = 1;
			version_needed = 45;
		} else if (zip->entry_compression == COMPRESSION_STORE) {
			version_needed = 10;
		} else {
			version_needed = 20;
		}
	}

	/* Format the local header. */
	memset(local_header, 0, sizeof(local_header));
	memcpy(local_header, "PK\003\004", 4);
	archive_le16enc(local_header + 4, version_needed);
	archive_le16enc(local_header + 6, zip->entry_flags);
	archive_le16enc(local_header + 8, zip->entry_compression);
	archive_le32enc(local_header + 10, dos_time(archive_entry_mtime(zip->entry)));
	archive_le32enc(local_header + 14, zip->entry_crc32);
	if (zip->entry_uses_zip64) {
		/* Zip64 data in the local header "must" include both
		 * compressed and uncompressed sizes AND those fields
		 * are included only if these are 0xffffffff;
		 * THEREFORE these must be set this way, even if we
		 * know one of them is smaller. */
		archive_le32enc(local_header + 18, ARCHIVE_LITERAL_LL(0xffffffff));
		archive_le32enc(local_header + 22, ARCHIVE_LITERAL_LL(0xffffffff));
	} else {
		archive_le32enc(local_header + 18, zip->entry_compressed_size);
		archive_le32enc(local_header + 22, zip->entry_uncompressed_size);
	}
	archive_le16enc(local_header + 26, filename_length);

	/* Format as much of central directory file header as we can: */
	zip->file_header = cd_alloc(zip, 46);
	/* If (zip->file_header == NULL) XXXX */
	++zip->central_directory_entries;
	memset(zip->file_header, 0, 46);
	memcpy(zip->file_header, "PK\001\002", 4);
	/* "Made by PKZip 2.0 on Unix." */
	archive_le16enc(zip->file_header + 4, 3 * 256 + version_needed);
	archive_le16enc(zip->file_header + 6, version_needed);
	archive_le16enc(zip->file_header + 8, zip->entry_flags);
	archive_le16enc(zip->file_header + 10, zip->entry_compression);
	archive_le32enc(zip->file_header + 12, dos_time(archive_entry_mtime(zip->entry)));
	archive_le16enc(zip->file_header + 28, filename_length);
	/* Following Info-Zip, store mode in the "external attributes" field. */
	archive_le32enc(zip->file_header + 38,
	    ((uint32_t)archive_entry_mode(zip->entry)) << 16);
	e = cd_alloc(zip, filename_length);
	/* If (e == NULL) XXXX */
	copy_path(zip->entry, e);

	/* Format extra data. */
	memset(local_extra, 0, sizeof(local_extra));
	e = local_extra;

	/* First, extra blocks that are the same between
	 * the local file header and the central directory.
	 * We format them once and then duplicate them. */

	/* UT timestamp, length depends on what timestamps are set. */
	memcpy(e, "UT", 2);
	archive_le16enc(e + 2,
	    1
	    + (archive_entry_mtime_is_set(entry) ? 4 : 0)
	    + (archive_entry_atime_is_set(entry) ? 4 : 0)
	    + (archive_entry_ctime_is_set(entry) ? 4 : 0));
	e += 4;
	*e++ =
	    (archive_entry_mtime_is_set(entry) ? 1 : 0)
	    | (archive_entry_atime_is_set(entry) ? 2 : 0)
	    | (archive_entry_ctime_is_set(entry) ? 4 : 0);
	if (archive_entry_mtime_is_set(entry)) {
		archive_le32enc(e, (uint32_t)archive_entry_mtime(entry));
		e += 4;
	}
	if (archive_entry_atime_is_set(entry)) {
		archive_le32enc(e, (uint32_t)archive_entry_atime(entry));
		e += 4;
	}
	if (archive_entry_ctime_is_set(entry)) {
		archive_le32enc(e, (uint32_t)archive_entry_ctime(entry));
		e += 4;
	}

	/* ux Unix extra data, length 11, version 1 */
	/* TODO: If uid < 64k, use 2 bytes, ditto for gid. */
	memcpy(e, "ux\013\000\001", 5);
	e += 5;
	*e++ = 4; /* Length of following UID */
	archive_le32enc(e, (uint32_t)archive_entry_uid(entry));
	e += 4;
	*e++ = 4; /* Length of following GID */
	archive_le32enc(e, (uint32_t)archive_entry_gid(entry));
	e += 4;

	/* Copy UT and ux into central directory as well. */
	zip->file_header_extra_offset = zip->central_directory_bytes;
	cd_extra = cd_alloc(zip, e - local_extra);
	memcpy(cd_extra, local_extra, e - local_extra);

	/*
	 * Following extra blocks vary between local header and
	 * central directory. These are the local header versions.
	 * Central directory versions get formatted in
	 * archive_write_zip_finish_entry() below.
	 */

	/* "[Zip64 entry] in the local header MUST include BOTH
	 * original [uncompressed] and compressed size fields." */
	if (zip->entry_uses_zip64) {
		unsigned char *zip64_start = e;
		memcpy(e, "\001\000\020\000", 4);
		e += 4;
		archive_le64enc(e, zip->entry_uncompressed_size);
		e += 8;
		archive_le64enc(e, zip->entry_compressed_size);
		e += 8;
		archive_le16enc(zip64_start + 2, e - (zip64_start + 4));
	}

	if (zip->flags & ZIP_FLAG_EXPERIMENT_EL) {
		/* Experimental 'el' extension to improve streaming. */
		unsigned char *external_info = e;
		int included = 7;
		memcpy(e, "el\000\000", 4); // 0x6c65 + 2-byte length
		e += 4;
		e[0] = included; /* bitmap of included fields */
		e += 1;
		if (included & 1) {
			archive_le16enc(e, /* "Version created by" */
			    3 * 256 + version_needed);
			e += 2;
		}
		if (included & 2) {
			archive_le16enc(e, 0); /* internal file attributes */
			e += 2;
		}
		if (included & 4) {
			archive_le32enc(e,  /* external file attributes */
			    ((uint32_t)archive_entry_mode(zip->entry)) << 16);
			e += 4;
		}
		if (included & 8) {
			// Libarchive does not currently support file comments.
		}
		archive_le16enc(external_info + 2, e - (external_info + 4));
	}

	/* Update local header with size of extra data and write it all out: */
	archive_le16enc(local_header + 28, e - local_extra);

	ret = __archive_write_output(a, local_header, 30);
	if (ret != ARCHIVE_OK)
		return (ARCHIVE_FATAL);
	zip->written_bytes += 30;

	ret = write_path(zip->entry, a);
	if (ret <= ARCHIVE_OK)
		return (ARCHIVE_FATAL);
	zip->written_bytes += ret;

	ret = __archive_write_output(a, local_extra, e - local_extra);
	if (ret != ARCHIVE_OK)
		return (ARCHIVE_FATAL);
	zip->written_bytes += e - local_extra;

	/* For symlinks, write the body now. */
	if (slink != NULL) {
		ret = __archive_write_output(a, slink, slink_size);
		if (ret != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
		zip->entry_compressed_written += slink_size;
		zip->entry_uncompressed_written += slink_size;
		zip->written_bytes += slink_size;
	}

#ifdef HAVE_ZLIB_H
	if (zip->entry_compression == COMPRESSION_DEFLATE) {
		zip->stream.zalloc = Z_NULL;
		zip->stream.zfree = Z_NULL;
		zip->stream.opaque = Z_NULL;
		zip->stream.next_out = zip->buf;
		zip->stream.avail_out = (uInt)zip->len_buf;
		if (deflateInit2(&zip->stream, Z_DEFAULT_COMPRESSION,
		    Z_DEFLATED, -15, 8, Z_DEFAULT_STRATEGY) != Z_OK) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't init deflate compressor");
			return (ARCHIVE_FATAL);
		}
	}
#endif

	return (ret2);
}